

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall
kj::_::XThreadEvent::fire(XThreadEvent *this)

{
  PromiseArenaMember *pPVar1;
  Event *extraout_RDX;
  Event *extraout_RDX_00;
  Event *extraout_RDX_01;
  Event *extraout_RDX_02;
  Event *extraout_RDX_03;
  Event *extraout_RDX_04;
  Event *pEVar2;
  long *in_RSI;
  Exception *exception;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar3;
  NullableValue<kj::Exception> _exception1145;
  PromiseArenaMember *local_370;
  undefined1 local_368;
  undefined1 local_1c8;
  
  if (in_RSI[0xf] == 0) {
    (**(code **)(*in_RSI + 0x28))(&local_370);
    pPVar1 = (PromiseArenaMember *)in_RSI[0xf];
    in_RSI[0xf] = (long)local_370;
    local_370 = (PromiseArenaMember *)0x0;
    pEVar2 = extraout_RDX_01;
    if (pPVar1 != (PromiseArenaMember *)0x0) {
      PromiseDisposer::dispose(pPVar1);
      pEVar2 = extraout_RDX_02;
    }
    pPVar1 = local_370;
    if (local_370 != (PromiseArenaMember *)0x0) {
      local_370 = (PromiseArenaMember *)0x0;
      PromiseDisposer::dispose(pPVar1);
      pEVar2 = extraout_RDX_03;
    }
    local_1c8 = 0;
    local_368 = 0;
    if (in_RSI[0xf] != 0) {
      (**(code **)(*(long *)in_RSI[0xf] + 8))((long *)in_RSI[0xf],in_RSI + 2);
      (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
           (_func_int **)0x0;
      (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x0;
      pEVar2 = extraout_RDX_04;
      goto LAB_00475443;
    }
  }
  else {
    (**(code **)(*(long *)in_RSI[0xf] + 0x18))((long *)in_RSI[0xf],in_RSI[10]);
    pPVar1 = (PromiseArenaMember *)in_RSI[0xf];
    in_RSI[0xf] = 0;
    pEVar2 = extraout_RDX;
    if (pPVar1 != (PromiseArenaMember *)0x0) {
      PromiseDisposer::dispose(pPVar1);
      pEVar2 = extraout_RDX_00;
    }
  }
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&fire::DISPOSER;
  (this->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)(in_RSI + 2);
LAB_00475443:
  MVar3.ptr.ptr = pEVar2;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar3.ptr;
}

Assistant:

Maybe<Own<Event>> XThreadEvent::fire() {
  static constexpr DelayedDoneHack DISPOSER {};

  KJ_IF_SOME(n, promiseNode) {
    n->get(result);
    promiseNode = kj::none;  // make sure to destroy in the thread that created it
    return Own<Event>(this, DISPOSER);
  } else {
    KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
      promiseNode = execute();
    })) {
      result.addException(kj::mv(exception));
    };
    KJ_IF_SOME(n, promiseNode) {
      n->onReady(this);
    } else {
      return Own<Event>(this, DISPOSER);
    }
  }